

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

void BN_with_flags(BIGNUM *dest,BIGNUM *b,int flags)

{
  int flags_local;
  BIGNUM *b_local;
  BIGNUM *dest_local;
  
  dest->d = b->d;
  dest->top = b->top;
  dest->dmax = b->dmax;
  dest->neg = b->neg;
  dest->flags = dest->flags & 1U | b->flags & 0xfffffffeU | 2 | flags;
  return;
}

Assistant:

void BN_with_flags(BIGNUM *dest, const BIGNUM *b, int flags)
{
    dest->d = b->d;
    dest->top = b->top;
    dest->dmax = b->dmax;
    dest->neg = b->neg;
    dest->flags = ((dest->flags & BN_FLG_MALLOCED)
                   | (b->flags & ~BN_FLG_MALLOCED)
                   | BN_FLG_STATIC_DATA | flags);
}